

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Trivia __thiscall
slang::parsing::Preprocessor::handleUnconnectedDriveDirective(Preprocessor *this,Token directive)

{
  Token *pTVar1;
  undefined2 uVar2;
  undefined1 uVar4;
  undefined1 uVar5;
  Info *pIVar3;
  undefined4 uVar6;
  undefined1 uVar7;
  NumericTokenFlags NVar8;
  uint32_t uVar9;
  SourceLocation SVar10;
  UnconnectedDriveDirectiveSyntax *syntax;
  bool bVar11;
  Token TVar12;
  string_view sVar13;
  Token local_68;
  Token local_58;
  Trivia local_48;
  Token local_38;
  
  local_58.info = directive.info;
  local_58._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  Token::Token(&local_68);
  pTVar1 = &this->currentToken;
  pIVar3 = (this->currentToken).info;
  if (pIVar3 == (Info *)0x0) {
    TVar12 = nextProcessed(this);
    this->currentToken = TVar12;
  }
  else {
    uVar2 = pTVar1->kind;
    uVar4 = pTVar1->field_0x2;
    uVar5 = pTVar1->numFlags;
    uVar6 = pTVar1->rawLen;
    TVar12.rawLen = uVar6;
    TVar12.numFlags.raw = uVar5;
    TVar12._2_1_ = uVar4;
    TVar12.kind = uVar2;
    TVar12.info = pIVar3;
  }
  if ((TVar12._0_4_ & 0xfffe) == 0xf2) {
    if (TVar12.info == (Info *)0x0) {
      TVar12 = nextProcessed(this);
      this->currentToken = TVar12;
    }
    uVar7 = pTVar1->field_0x2;
    NVar8.raw = (pTVar1->numFlags).raw;
    uVar9 = pTVar1->rawLen;
    pIVar3 = (this->currentToken).info;
    (this->lastConsumed).kind = pTVar1->kind;
    (this->lastConsumed).field_0x2 = uVar7;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar8.raw;
    (this->lastConsumed).rawLen = uVar9;
    (this->lastConsumed).info = pIVar3;
    Token::Token(&local_38);
    pTVar1->kind = local_38.kind;
    pTVar1->field_0x2 = local_38._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_38.numFlags.raw;
    pTVar1->rawLen = local_38.rawLen;
    (this->currentToken).info = local_38.info;
    this->unconnectedDrive = TVar12.kind;
    local_68.info = TVar12.info;
  }
  else {
    TVar12 = local_68;
  }
  local_68 = TVar12;
  bVar11 = local_68.info == (Info *)0x0;
  if (bVar11) {
    SVar10 = Token::location(&local_58);
    sVar13 = Token::rawText(&local_58);
    SVar10 = (SourceLocation)((long)SVar10 + sVar13._M_len * 0x10000000);
    Diagnostics::add(this->diagnostics,(DiagCode)0x30004,SVar10);
    local_68 = Token::createMissing(this->alloc,Pull0Keyword,SVar10);
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::UnconnectedDriveDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&local_58,&local_68);
  Trivia::Trivia(&local_48,Directive,(SyntaxNode *)syntax);
  return local_48;
}

Assistant:

Trivia Preprocessor::handleUnconnectedDriveDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token strength;
    switch (peek().kind) {
        case TokenKind::Pull0Keyword:
        case TokenKind::Pull1Keyword:
            strength = consume();
            unconnectedDrive = strength.kind;
            break;
        default:
            break;
    }

    if (!strength) {
        auto loc = directive.location() + directive.rawText().length();
        addDiag(diag::ExpectedDriveStrength, loc);
        strength = Token::createMissing(alloc, TokenKind::Pull0Keyword, loc);
    }

    auto result = alloc.emplace<UnconnectedDriveDirectiveSyntax>(directive, strength);
    return Trivia(TriviaKind::Directive, result);
}